

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O3

bool __thiscall ON_BrepRegionTopology::Read(ON_BrepRegionTopology *this,ON_BinaryArchive *file)

{
  int iVar1;
  ON_BrepFaceSide *pOVar2;
  ON_BrepRegion *pOVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int major_version;
  int minor_version;
  int local_28 [2];
  
  local_28[0] = 0;
  local_28[1] = 0;
  bVar5 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28,local_28 + 1);
  if (!bVar5) {
    return false;
  }
  if (local_28[0] == 1) {
    bVar5 = ON_BrepFaceSideArray::Read(&this->m_FS,file);
    auVar4 = _DAT_0069b120;
    iVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>.
            m_count;
    if (0 < (long)iVar1) {
      pOVar2 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
               super_ON_ClassArray<ON_BrepFaceSide>.m_a;
      lVar7 = (long)iVar1 + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar8 = auVar8 ^ _DAT_0069b120;
      auVar12 = _DAT_0069b170;
      do {
        auVar11 = auVar12 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + lVar7) = this;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(ON_BrepRegionTopology **)((long)&pOVar2[1].m_rtop + lVar7) = this;
        }
        lVar10 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x60;
      } while ((ulong)(iVar1 + 1U >> 1) * 0x60 != lVar7);
    }
    if (bVar5) {
      bVar5 = ON_BrepRegionArray::Read(&this->m_R,file);
      auVar4 = _DAT_0069b120;
      iVar1 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
              m_count;
      if (0 < (long)iVar1) {
        pOVar3 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
                 m_a;
        lVar7 = (long)iVar1 + -1;
        auVar9._8_4_ = (int)lVar7;
        auVar9._0_8_ = lVar7;
        auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar9 = auVar9 ^ _DAT_0069b120;
        auVar11 = _DAT_0069b170;
        do {
          auVar12 = auVar11 ^ auVar4;
          if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                      auVar9._4_4_ < auVar12._4_4_) & 1)) {
            *(ON_BrepRegionTopology **)((long)&pOVar3->m_rtop + lVar7) = this;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            *(ON_BrepRegionTopology **)((long)&pOVar3[1].m_rtop + lVar7) = this;
          }
          lVar10 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar10 + 2;
          lVar7 = lVar7 + 0xf0;
        } while ((ulong)(iVar1 + 1U >> 1) * 0xf0 - lVar7 != 0);
      }
      goto LAB_0040b123;
    }
  }
  bVar5 = false;
LAB_0040b123:
  bVar6 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar6 & bVar5);
}

Assistant:

bool ON_BrepRegionTopology::Read( ON_BinaryArchive& file )
{
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = m_FS.Read(file);
    for ( i = 0; i < m_FS.Count(); i++ )
      m_FS[i].m_rtop = this;
    if (!rc) break;

    rc = m_R.Read(file);
    for ( i = 0; i < m_R.Count(); i++ )
      m_R[i].m_rtop = this;
    if (!rc) break;

    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
  return rc;
}